

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O0

void __thiscall cmCustomCommand::SetComment(cmCustomCommand *this,char *comment)

{
  char *local_28;
  char *comment_local;
  cmCustomCommand *this_local;
  
  local_28 = comment;
  if (comment == (char *)0x0) {
    local_28 = "";
  }
  std::__cxx11::string::operator=((string *)&this->Comment,local_28);
  this->HaveComment = comment != (char *)0x0;
  return;
}

Assistant:

void cmCustomCommand::SetComment(const char* comment)
{
  this->Comment = comment ? comment : "";
  this->HaveComment = (comment != nullptr);
}